

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::analysis::TypeManager::RebuildType(TypeManager *this,uint32_t type_id,Type *type)

{
  undefined1 index_00 [4];
  bool bVar1;
  Kind KVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  pointer pTVar6;
  pointer puVar7;
  LengthInfo *args_1;
  undefined4 extraout_var;
  map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  *this_00;
  reference ppVar8;
  Function *this_01;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *pvVar9;
  size_type sVar10;
  reference ppTVar11;
  undefined4 extraout_var_00;
  Type *pTVar12;
  undefined4 extraout_var_01;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_02;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar13;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_5c8;
  undefined1 local_5c0;
  undefined1 local_5b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> copy_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  uint32_t local_578;
  uint32_t local_574;
  Type *local_570;
  unique_ptr<spvtools::opt::analysis::CooperativeMatrixKHR,_std::default_delete<spvtools::opt::analysis::CooperativeMatrixKHR>_>
  local_568;
  Type *local_560;
  Type *component_type_1;
  CooperativeMatrixKHR *cm_type_1;
  uint32_t local_548;
  uint32_t local_544;
  Type *local_540;
  unique_ptr<spvtools::opt::analysis::CooperativeMatrixNV,_std::default_delete<spvtools::opt::analysis::CooperativeMatrixNV>_>
  local_538;
  Type *local_530;
  Type *component_type;
  CooperativeMatrixNV *cm_type;
  Pointer *target_ptr;
  unique_ptr<spvtools::opt::analysis::ForwardPointer,_std::default_delete<spvtools::opt::analysis::ForwardPointer>_>
  local_510;
  ForwardPointer *local_508;
  ForwardPointer *forward_ptr_ty;
  unique_ptr<spvtools::opt::analysis::Function,_std::default_delete<spvtools::opt::analysis::Function>_>
  local_4f8;
  Type *local_4f0;
  Type *local_4e8;
  Type *param_ty;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4_2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  Type *ret_ty;
  Function *function_ty;
  Type *local_498;
  unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  local_490;
  Type *local_488;
  Type *ele_ty_7;
  Pointer *pointer_ty;
  vector<unsigned_int,_std::allocator<unsigned_int>_> copy;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dec;
  iterator __end5;
  iterator __begin5;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range5;
  undefined1 local_438 [4];
  uint32_t index;
  pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  pair;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  *__range4_1;
  Struct *rebuilt_struct;
  Type *local_3f0;
  Type *local_3e8;
  Type *ele_ty_6;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  subtypes;
  Struct *struct_ty;
  unique_ptr<spvtools::opt::analysis::RuntimeArray,_std::default_delete<spvtools::opt::analysis::RuntimeArray>_>
  local_3a0;
  Type *local_398;
  Type *ele_ty_5;
  RuntimeArray *array_ty_1;
  unique_ptr<spvtools::opt::analysis::Array,_std::default_delete<spvtools::opt::analysis::Array>_>
  local_380;
  Type *local_378;
  Type *ele_ty_4;
  Array *array_ty;
  unique_ptr<spvtools::opt::analysis::SampledImage,_std::default_delete<spvtools::opt::analysis::SampledImage>_>
  local_360;
  Type *local_358;
  Type *ele_ty_3;
  SampledImage *image_ty_1;
  uint32_t local_340;
  bool local_33a;
  bool local_339;
  uint32_t local_338;
  Dim local_334;
  Type *local_330;
  unique_ptr<spvtools::opt::analysis::Image,_std::default_delete<spvtools::opt::analysis::Image>_>
  local_328;
  Type *local_320;
  Type *ele_ty_2;
  Image *image_ty;
  Type *local_308;
  unique_ptr<spvtools::opt::analysis::Matrix,_std::default_delete<spvtools::opt::analysis::Matrix>_>
  local_300;
  Type *local_2f8;
  Type *ele_ty_1;
  Matrix *mat_ty;
  Type *local_2e0;
  unique_ptr<spvtools::opt::analysis::Vector,_std::default_delete<spvtools::opt::analysis::Vector>_>
  local_2d8;
  Type *local_2d0;
  Type *ele_ty;
  Vector *vec_ty;
  undefined1 local_2b8;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_2b0;
  undefined1 local_2a8;
  Type local_2a0;
  Type local_278;
  Type local_250;
  Type local_228;
  Type local_200;
  Type local_1d8;
  Type local_1b0;
  Type local_188;
  Type local_160;
  Type local_138;
  Type local_110;
  Type local_e8;
  Type local_c0;
  Type local_98;
  Type local_70;
  undefined1 local_48 [24];
  Type *pool_ty;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  rebuilt_ty;
  Type *type_local;
  uint32_t type_id_local;
  TypeManager *this_local;
  
  rebuilt_ty._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>,_true,_true>
          )type;
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x207,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
  std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::Type>,void>
            ((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
              *)&pool_ty);
  local_48._16_8_ = GetType(this,type_id);
  this_local = (TypeManager *)local_48._16_8_;
  if ((TypeManager *)local_48._16_8_ != (TypeManager *)0x0) goto LAB_002714c0;
  KVar2 = Type::kind((Type *)rebuilt_ty._M_t.
                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                             _M_head_impl);
  switch(KVar2) {
  case kVoid:
    Type::Clone((Type *)local_48);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)local_48);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)local_48);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_70.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_70.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_70.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_70.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_70.kind_._0_1_ =
         local_70.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_70.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kBool:
    Type::Clone(&local_70);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_70);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_70);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_98.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_98.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_98.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98.kind_._0_1_ =
         local_98.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_98.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kInteger:
    Type::Clone(&local_98);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_98);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_98);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_c0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_c0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_c0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.kind_._0_1_ =
         local_c0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_c0.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kFloat:
    Type::Clone(&local_c0);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_c0);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_c0);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_e8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_e8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_e8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_e8.kind_._0_1_ =
         local_e8.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_e8.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kVector:
    ele_ty = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                           .
                                           super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                           ._M_head_impl + 0x70))();
    local_2d0 = Vector::element_type((Vector *)ele_ty);
    uVar5 = GetId(this,local_2d0);
    local_2e0 = RebuildType(this,uVar5,local_2d0);
    mat_ty._4_4_ = Vector::element_count((Vector *)ele_ty);
    MakeUnique<spvtools::opt::analysis::Vector,spvtools::opt::analysis::Type*,unsigned_int>
              ((spvtools *)&local_2d8,&local_2e0,(uint *)((long)&mat_ty + 4));
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_2d8);
    std::
    unique_ptr<spvtools::opt::analysis::Vector,_std::default_delete<spvtools::opt::analysis::Vector>_>
    ::~unique_ptr(&local_2d8);
    goto LAB_002713bf;
  case kMatrix:
    ele_ty_1 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0x80))();
    local_2f8 = Matrix::element_type((Matrix *)ele_ty_1);
    uVar5 = GetId(this,local_2f8);
    local_308 = RebuildType(this,uVar5,local_2f8);
    image_ty._4_4_ = Matrix::element_count((Matrix *)ele_ty_1);
    MakeUnique<spvtools::opt::analysis::Matrix,spvtools::opt::analysis::Type*,unsigned_int>
              ((spvtools *)&local_300,&local_308,(uint *)((long)&image_ty + 4));
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_300);
    std::
    unique_ptr<spvtools::opt::analysis::Matrix,_std::default_delete<spvtools::opt::analysis::Matrix>_>
    ::~unique_ptr(&local_300);
    goto LAB_002713bf;
  case kImage:
    ele_ty_2 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0x90))();
    local_320 = Image::sampled_type((Image *)ele_ty_2);
    uVar5 = GetId(this,local_320);
    local_330 = RebuildType(this,uVar5,local_320);
    local_334 = Image::dim((Image *)ele_ty_2);
    local_338 = Image::depth((Image *)ele_ty_2);
    local_339 = Image::is_arrayed((Image *)ele_ty_2);
    local_33a = Image::is_multisampled((Image *)ele_ty_2);
    local_340 = Image::sampled((Image *)ele_ty_2);
    image_ty_1._4_4_ = Image::format((Image *)ele_ty_2);
    image_ty_1._0_4_ = Image::access_qualifier((Image *)ele_ty_2);
    MakeUnique<spvtools::opt::analysis::Image,spvtools::opt::analysis::Type*,spv::Dim,unsigned_int,bool,bool,unsigned_int,spv::ImageFormat,spv::AccessQualifier>
              ((spvtools *)&local_328,&local_330,&local_334,&local_338,&local_339,&local_33a,
               &local_340,(ImageFormat *)((long)&image_ty_1 + 4),(AccessQualifier *)&image_ty_1);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_328);
    std::
    unique_ptr<spvtools::opt::analysis::Image,_std::default_delete<spvtools::opt::analysis::Image>_>
    ::~unique_ptr(&local_328);
    goto LAB_002713bf;
  case kSampler:
    Type::Clone(&local_e8);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_e8);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_e8);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_110.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_110.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_110.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_110.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_110.kind_._0_1_ =
         local_110.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_110.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kSampledImage:
    ele_ty_3 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0xb0))();
    local_358 = SampledImage::image_type((SampledImage *)ele_ty_3);
    uVar5 = GetId(this,local_358);
    array_ty = (Array *)RebuildType(this,uVar5,local_358);
    MakeUnique<spvtools::opt::analysis::SampledImage,spvtools::opt::analysis::Type*>
              ((spvtools *)&local_360,(Type **)&array_ty);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_360);
    std::
    unique_ptr<spvtools::opt::analysis::SampledImage,_std::default_delete<spvtools::opt::analysis::SampledImage>_>
    ::~unique_ptr(&local_360);
    goto LAB_002713bf;
  case kArray:
    ele_ty_4 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0xc0))();
    local_378 = Array::element_type((Array *)ele_ty_4);
    uVar5 = GetId(this,local_378);
    array_ty_1 = (RuntimeArray *)RebuildType(this,uVar5,local_378);
    args_1 = Array::length_info((Array *)ele_ty_4);
    MakeUnique<spvtools::opt::analysis::Array,spvtools::opt::analysis::Type*,spvtools::opt::analysis::Array::LengthInfo_const&>
              ((spvtools *)&local_380,(Type **)&array_ty_1,args_1);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_380);
    std::
    unique_ptr<spvtools::opt::analysis::Array,_std::default_delete<spvtools::opt::analysis::Array>_>
    ::~unique_ptr(&local_380);
    goto LAB_002713bf;
  case kRuntimeArray:
    ele_ty_5 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0xd0))();
    local_398 = RuntimeArray::element_type((RuntimeArray *)ele_ty_5);
    uVar5 = GetId(this,local_398);
    struct_ty = (Struct *)RebuildType(this,uVar5,local_398);
    MakeUnique<spvtools::opt::analysis::RuntimeArray,spvtools::opt::analysis::Type*>
              ((spvtools *)&local_3a0,(Type **)&struct_ty);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_3a0);
    std::
    unique_ptr<spvtools::opt::analysis::RuntimeArray,_std::default_delete<spvtools::opt::analysis::RuntimeArray>_>
    ::~unique_ptr(&local_3a0);
    goto LAB_002713bf;
  case kStruct:
    subtypes.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(**(code **)(*(long *)rebuilt_ty._M_t.
                                        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                        .
                                        super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                        ._M_head_impl + 0xe0))();
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              *)&__range4);
    pvVar9 = Struct::element_types
                       ((Struct *)
                        subtypes.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar10 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::size(pvVar9);
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               *)&__range4,sVar10);
    pvVar9 = Struct::element_types
                       ((Struct *)
                        subtypes.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end4 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::begin(pvVar9);
    ele_ty_6 = (Type *)std::
                       vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                       ::end(pvVar9);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                       *)&ele_ty_6), bVar1) {
      ppTVar11 = __gnu_cxx::
                 __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                 ::operator*(&__end4);
      local_3e8 = *ppTVar11;
      uVar5 = GetId(this,local_3e8);
      local_3f0 = RebuildType(this,uVar5,local_3e8);
      std::
      vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ::push_back((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)&__range4,&local_3f0);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end4);
    }
    MakeUnique<spvtools::opt::analysis::Struct,std::vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>&>
              ((spvtools *)&rebuilt_struct,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&__range4);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,
              (unique_ptr<spvtools::opt::analysis::Struct,_std::default_delete<spvtools::opt::analysis::Struct>_>
               *)&rebuilt_struct);
    std::
    unique_ptr<spvtools::opt::analysis::Struct,_std::default_delete<spvtools::opt::analysis::Struct>_>
    ::~unique_ptr((unique_ptr<spvtools::opt::analysis::Struct,_std::default_delete<spvtools::opt::analysis::Struct>_>
                   *)&rebuilt_struct);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::operator->((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           *)&pool_ty);
    iVar3 = (*pTVar6->_vptr_Type[0x1b])();
    this_00 = Struct::element_decorations
                        ((Struct *)
                         subtypes.
                         super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end4_1 = std::
               map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
               ::begin(this_00);
    pair.second.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                  ::end(this_00);
    while (bVar1 = std::operator!=(&__end4_1,
                                   (_Self *)&pair.second.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          bVar1) {
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator*(&__end4_1);
      std::
      pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::pair((pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_438,ppVar8);
      index_00 = local_438;
      __end5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&pair);
      dec = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&pair);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                         *)&dec), bVar1) {
        copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator*(&__end5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pointer_ty,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        Struct::AddMemberDecoration
                  ((Struct *)CONCAT44(extraout_var,iVar3),(uint32_t)index_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pointer_ty);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pointer_ty);
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
        ::operator++(&__end5);
      }
      std::
      pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~pair((pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)local_438);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
      ::operator++(&__end4_1);
    }
    local_48._12_4_ = 2;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               *)&__range4);
    goto LAB_002713bf;
  case kOpaque:
    Type::Clone(&local_110);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_110);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_110);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_138.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_138.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_138.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_138.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_138.kind_._0_1_ =
         local_138.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_138.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kPointer:
    ele_ty_7 = (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                             .
                                             super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                             ._M_head_impl + 0x100))();
    local_488 = Pointer::pointee_type((Pointer *)ele_ty_7);
    uVar5 = GetId(this,local_488);
    local_498 = RebuildType(this,uVar5,local_488);
    function_ty._4_4_ = Pointer::storage_class((Pointer *)ele_ty_7);
    MakeUnique<spvtools::opt::analysis::Pointer,spvtools::opt::analysis::Type*,spv::StorageClass>
              ((spvtools *)&local_490,&local_498,(StorageClass *)((long)&function_ty + 4));
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_490);
    std::
    unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    ::~unique_ptr(&local_490);
    goto LAB_002713bf;
  case kFunction:
    this_01 = (Function *)
              (**(code **)(*(long *)rebuilt_ty._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                                    _M_head_impl + 0x110))();
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Function::return_type(this_01);
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              *)&__range4_2);
    pvVar9 = Function::param_types(this_01);
    sVar10 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::size(pvVar9);
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::reserve((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               *)&__range4_2,sVar10);
    pvVar9 = Function::param_types(this_01);
    __end4_2 = std::
               vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               ::begin(pvVar9);
    param_ty = (Type *)std::
                       vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                       ::end(pvVar9);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4_2,
                              (__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                               *)&param_ty), bVar1) {
      ppTVar11 = __gnu_cxx::
                 __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                 ::operator*(&__end4_2);
      local_4e8 = *ppTVar11;
      uVar5 = GetId(this,local_4e8);
      local_4f0 = RebuildType(this,uVar5,local_4e8);
      std::
      vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ::push_back((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)&__range4_2,&local_4f0);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end4_2);
    }
    uVar5 = GetId(this,(Type *)param_types.
                               super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    forward_ptr_ty =
         (ForwardPointer *)
         RebuildType(this,uVar5,
                     (Type *)param_types.
                             super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    MakeUnique<spvtools::opt::analysis::Function,spvtools::opt::analysis::Type*,std::vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>&>
              ((spvtools *)&local_4f8,(Type **)&forward_ptr_ty,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&__range4_2);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_4f8);
    std::
    unique_ptr<spvtools::opt::analysis::Function,_std::default_delete<spvtools::opt::analysis::Function>_>
    ::~unique_ptr(&local_4f8);
    local_48._12_4_ = 2;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               *)&__range4_2);
    goto LAB_002713bf;
  case kEvent:
    Type::Clone(&local_138);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_138);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_138);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_160.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_160.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_160.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_160.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_160.kind_._0_1_ =
         local_160.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_160.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kDeviceEvent:
    Type::Clone(&local_160);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_160);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_160);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_188.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_188.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_188.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_188.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_188.kind_._0_1_ =
         local_188.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_188.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kReserveId:
    Type::Clone(&local_188);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_188);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_188);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_1b0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_1b0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_1b0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1b0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1b0.kind_._0_1_ =
         local_1b0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_1b0.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kQueue:
    Type::Clone(&local_1b0);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_1b0);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_1b0);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_1d8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_1d8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_1d8.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1d8.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8.kind_._0_1_ =
         local_1d8.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_1d8.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kPipe:
    Type::Clone(&local_1d8);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_1d8);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_1d8);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_200.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_200.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_200.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_200.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_200.kind_._0_1_ =
         local_200.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_200.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kForwardPointer:
    local_508 = (ForwardPointer *)
                (**(code **)(*(long *)rebuilt_ty._M_t.
                                      super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                      .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                      ._M_head_impl + 0x170))();
    target_ptr._4_4_ = ForwardPointer::target_id(local_508);
    target_ptr._0_4_ = ForwardPointer::storage_class(local_508);
    MakeUnique<spvtools::opt::analysis::ForwardPointer,unsigned_int,spv::StorageClass>
              ((spvtools *)&local_510,(uint *)((long)&target_ptr + 4),(StorageClass *)&target_ptr);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_510);
    std::
    unique_ptr<spvtools::opt::analysis::ForwardPointer,_std::default_delete<spvtools::opt::analysis::ForwardPointer>_>
    ::~unique_ptr(&local_510);
    cm_type = (CooperativeMatrixNV *)ForwardPointer::target_pointer(local_508);
    if (cm_type != (CooperativeMatrixNV *)0x0) {
      pTVar6 = std::
               unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ::operator->((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                             *)&pool_ty);
      iVar3 = (*pTVar6->_vptr_Type[0x2d])();
      uVar5 = GetId(this,&cm_type->super_Type);
      pTVar12 = RebuildType(this,uVar5,&cm_type->super_Type);
      iVar4 = (*pTVar12->_vptr_Type[0x1f])();
      ForwardPointer::SetTargetPointer
                ((ForwardPointer *)CONCAT44(extraout_var_00,iVar3),
                 (Pointer *)CONCAT44(extraout_var_01,iVar4));
    }
    goto LAB_002713bf;
  case kPipeStorage:
    Type::Clone(&local_200);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_200);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_200);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_228.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_228.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_228.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_228.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_228.kind_._0_1_ =
         local_228.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_228.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kNamedBarrier:
    Type::Clone(&local_228);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_228);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_228);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_250.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_250.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_250.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_250.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_250.kind_._0_1_ =
         local_250.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_250.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kAccelerationStructureNV:
    Type::Clone(&local_250);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_250);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_250);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_278.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_278.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_278.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_278.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.kind_._0_1_ =
         local_278.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_278.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kCooperativeMatrixNV:
    component_type =
         (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                       super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                       .
                                       super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                       ._M_head_impl + 0x1b0))();
    local_530 = CooperativeMatrixNV::component_type((CooperativeMatrixNV *)component_type);
    uVar5 = GetId(this,local_530);
    local_540 = RebuildType(this,uVar5,local_530);
    local_544 = CooperativeMatrixNV::scope_id((CooperativeMatrixNV *)component_type);
    local_548 = CooperativeMatrixNV::rows_id((CooperativeMatrixNV *)component_type);
    cm_type_1._4_4_ = CooperativeMatrixNV::columns_id((CooperativeMatrixNV *)component_type);
    MakeUnique<spvtools::opt::analysis::CooperativeMatrixNV,spvtools::opt::analysis::Type*,unsigned_int,unsigned_int,unsigned_int>
              ((spvtools *)&local_538,&local_540,&local_544,&local_548,
               (uint *)((long)&cm_type_1 + 4));
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_538);
    std::
    unique_ptr<spvtools::opt::analysis::CooperativeMatrixNV,_std::default_delete<spvtools::opt::analysis::CooperativeMatrixNV>_>
    ::~unique_ptr(&local_538);
    goto LAB_002713bf;
  case kCooperativeMatrixKHR:
    component_type_1 =
         (Type *)(**(code **)(*(long *)rebuilt_ty._M_t.
                                       super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                       .
                                       super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                       ._M_head_impl + 0x1c0))();
    local_560 = CooperativeMatrixKHR::component_type((CooperativeMatrixKHR *)component_type_1);
    uVar5 = GetId(this,local_560);
    local_570 = RebuildType(this,uVar5,local_560);
    local_574 = CooperativeMatrixKHR::scope_id((CooperativeMatrixKHR *)component_type_1);
    local_578 = CooperativeMatrixKHR::rows_id((CooperativeMatrixKHR *)component_type_1);
    __range2._4_4_ = CooperativeMatrixKHR::columns_id((CooperativeMatrixKHR *)component_type_1);
    __range2._0_4_ = CooperativeMatrixKHR::use_id((CooperativeMatrixKHR *)component_type_1);
    MakeUnique<spvtools::opt::analysis::CooperativeMatrixKHR,spvtools::opt::analysis::Type*,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              ((spvtools *)&local_568,&local_570,&local_574,&local_578,(uint *)((long)&__range2 + 4)
               ,(uint *)&__range2);
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    operator=((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
               *)&pool_ty,&local_568);
    std::
    unique_ptr<spvtools::opt::analysis::CooperativeMatrixKHR,_std::default_delete<spvtools::opt::analysis::CooperativeMatrixKHR>_>
    ::~unique_ptr(&local_568);
LAB_002713bf:
    this_02 = Type::decorations((Type *)rebuilt_ty._M_t.
                                        super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                                        .
                                        super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>
                                        ._M_head_impl);
    __end2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin(this_02);
    dec_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                       *)&dec_1), bVar1) {
      copy_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator*(&__end2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 copy_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      pTVar6 = std::
               unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ::operator->((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                             *)&pool_ty);
      Type::AddDecoration(pTVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8);
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::operator++(&__end2);
    }
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,(value_type *)&pool_ty);
    local_5c8._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
         ._M_cur;
    local_5c0 = pVar13.second;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_5c8);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kRayQueryKHR:
    Type::Clone(&local_278);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_278);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_278);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    local_2a0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)pVar13.first.
                  super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                  ._M_cur;
    local_2a0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = pVar13.second;
    local_2a0.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2a0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2a0.kind_._0_1_ =
         local_2a0.decorations_.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_1_;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_2a0.decorations_.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  case kHitObjectNV:
    Type::Clone(&local_2a0);
    pTVar6 = std::
             unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
             ::release((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                        *)&local_2a0);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    reset((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)&pool_ty,pTVar6);
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&local_2a0);
    pVar13 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,
                      (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                       *)&pool_ty);
    vec_ty = (Vector *)
             pVar13.first.
             super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
             ._M_cur;
    local_2b8 = pVar13.second;
    local_2b0._M_cur = (__node_type *)vec_ty;
    local_2a8 = local_2b8;
    puVar7 = std::__detail::
             _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
             ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                           *)&local_2b0);
    this_local = (TypeManager *)
                 std::
                 unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 ::get(puVar7);
    break;
  default:
    __assert_fail("false && \"Unhandled type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x29f,
                  "Type *spvtools::opt::analysis::TypeManager::RebuildType(uint32_t, const Type &)")
    ;
  }
LAB_002714c0:
  local_48._12_4_ = 1;
  std::
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               *)&pool_ty);
  return (Type *)this_local;
}

Assistant:

Type* TypeManager::RebuildType(uint32_t type_id, const Type& type) {
  assert(type_id != 0);

  // The comparison and hash on the type pool will avoid inserting the rebuilt
  // type if an equivalent type already exists. The rebuilt type will be deleted
  // when it goes out of scope at the end of the function in that case. Repeated
  // insertions of the same Type will, at most, keep one corresponding object in
  // the type pool.
  std::unique_ptr<Type> rebuilt_ty;

  // If |type_id| is already present in the type pool, return the existing type.
  // This saves extra work in the type builder and prevents running into
  // circular issues (https://github.com/KhronosGroup/SPIRV-Tools/issues/5623).
  Type* pool_ty = GetType(type_id);
  if (pool_ty != nullptr) {
    return pool_ty;
  }

  switch (type.kind()) {
#define DefineNoSubtypeCase(kind)             \
  case Type::k##kind:                         \
    rebuilt_ty.reset(type.Clone().release()); \
    return type_pool_.insert(std::move(rebuilt_ty)).first->get()

    DefineNoSubtypeCase(Void);
    DefineNoSubtypeCase(Bool);
    DefineNoSubtypeCase(Integer);
    DefineNoSubtypeCase(Float);
    DefineNoSubtypeCase(Sampler);
    DefineNoSubtypeCase(Opaque);
    DefineNoSubtypeCase(Event);
    DefineNoSubtypeCase(DeviceEvent);
    DefineNoSubtypeCase(ReserveId);
    DefineNoSubtypeCase(Queue);
    DefineNoSubtypeCase(Pipe);
    DefineNoSubtypeCase(PipeStorage);
    DefineNoSubtypeCase(NamedBarrier);
    DefineNoSubtypeCase(AccelerationStructureNV);
    DefineNoSubtypeCase(RayQueryKHR);
    DefineNoSubtypeCase(HitObjectNV);
#undef DefineNoSubtypeCase
    case Type::kVector: {
      const Vector* vec_ty = type.AsVector();
      const Type* ele_ty = vec_ty->element_type();
      rebuilt_ty = MakeUnique<Vector>(RebuildType(GetId(ele_ty), *ele_ty),
                                      vec_ty->element_count());
      break;
    }
    case Type::kMatrix: {
      const Matrix* mat_ty = type.AsMatrix();
      const Type* ele_ty = mat_ty->element_type();
      rebuilt_ty = MakeUnique<Matrix>(RebuildType(GetId(ele_ty), *ele_ty),
                                      mat_ty->element_count());
      break;
    }
    case Type::kImage: {
      const Image* image_ty = type.AsImage();
      const Type* ele_ty = image_ty->sampled_type();
      rebuilt_ty = MakeUnique<Image>(
          RebuildType(GetId(ele_ty), *ele_ty), image_ty->dim(),
          image_ty->depth(), image_ty->is_arrayed(),
          image_ty->is_multisampled(), image_ty->sampled(), image_ty->format(),
          image_ty->access_qualifier());
      break;
    }
    case Type::kSampledImage: {
      const SampledImage* image_ty = type.AsSampledImage();
      const Type* ele_ty = image_ty->image_type();
      rebuilt_ty =
          MakeUnique<SampledImage>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kArray: {
      const Array* array_ty = type.AsArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty = MakeUnique<Array>(RebuildType(GetId(ele_ty), *ele_ty),
                                     array_ty->length_info());
      break;
    }
    case Type::kRuntimeArray: {
      const RuntimeArray* array_ty = type.AsRuntimeArray();
      const Type* ele_ty = array_ty->element_type();
      rebuilt_ty =
          MakeUnique<RuntimeArray>(RebuildType(GetId(ele_ty), *ele_ty));
      break;
    }
    case Type::kStruct: {
      const Struct* struct_ty = type.AsStruct();
      std::vector<const Type*> subtypes;
      subtypes.reserve(struct_ty->element_types().size());
      for (const auto* ele_ty : struct_ty->element_types()) {
        subtypes.push_back(RebuildType(GetId(ele_ty), *ele_ty));
      }
      rebuilt_ty = MakeUnique<Struct>(subtypes);
      Struct* rebuilt_struct = rebuilt_ty->AsStruct();
      for (auto pair : struct_ty->element_decorations()) {
        uint32_t index = pair.first;
        for (const auto& dec : pair.second) {
          // Explicit copy intended.
          std::vector<uint32_t> copy(dec);
          rebuilt_struct->AddMemberDecoration(index, std::move(copy));
        }
      }
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer_ty = type.AsPointer();
      const Type* ele_ty = pointer_ty->pointee_type();
      rebuilt_ty = MakeUnique<Pointer>(RebuildType(GetId(ele_ty), *ele_ty),
                                       pointer_ty->storage_class());
      break;
    }
    case Type::kFunction: {
      const Function* function_ty = type.AsFunction();
      const Type* ret_ty = function_ty->return_type();
      std::vector<const Type*> param_types;
      param_types.reserve(function_ty->param_types().size());
      for (const auto* param_ty : function_ty->param_types()) {
        param_types.push_back(RebuildType(GetId(param_ty), *param_ty));
      }
      rebuilt_ty = MakeUnique<Function>(RebuildType(GetId(ret_ty), *ret_ty),
                                        param_types);
      break;
    }
    case Type::kForwardPointer: {
      const ForwardPointer* forward_ptr_ty = type.AsForwardPointer();
      rebuilt_ty = MakeUnique<ForwardPointer>(forward_ptr_ty->target_id(),
                                              forward_ptr_ty->storage_class());
      const Pointer* target_ptr = forward_ptr_ty->target_pointer();
      if (target_ptr) {
        rebuilt_ty->AsForwardPointer()->SetTargetPointer(
            RebuildType(GetId(target_ptr), *target_ptr)->AsPointer());
      }
      break;
    }
    case Type::kCooperativeMatrixNV: {
      const CooperativeMatrixNV* cm_type = type.AsCooperativeMatrixNV();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixNV>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id());
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      const CooperativeMatrixKHR* cm_type = type.AsCooperativeMatrixKHR();
      const Type* component_type = cm_type->component_type();
      rebuilt_ty = MakeUnique<CooperativeMatrixKHR>(
          RebuildType(GetId(component_type), *component_type),
          cm_type->scope_id(), cm_type->rows_id(), cm_type->columns_id(),
          cm_type->use_id());
      break;
    }
    default:
      assert(false && "Unhandled type");
      return nullptr;
  }
  for (const auto& dec : type.decorations()) {
    // Explicit copy intended.
    std::vector<uint32_t> copy(dec);
    rebuilt_ty->AddDecoration(std::move(copy));
  }

  return type_pool_.insert(std::move(rebuilt_ty)).first->get();
}